

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O3

bool __thiscall fast_float::bigint::shl(bigint *this,size_t n)

{
  uint16_t *puVar1;
  ulong uVar2;
  ushort uVar3;
  bool bVar4;
  ulong uVar5;
  
  if ((n & 0x3f) == 0) {
LAB_003c0042:
    if (0x3f < n) {
      uVar5 = n >> 6;
      uVar3 = (this->vec).length;
      uVar2 = uVar5 + uVar3;
      if (uVar2 < 0x3f && (ulong)uVar3 != 0) {
        memmove((this->vec).data + uVar5,this,(ulong)uVar3 << 3);
        memset(this,0,uVar5 * 8);
        puVar1 = &(this->vec).length;
        *puVar1 = *puVar1 + (short)uVar5;
      }
      else if (0x3e < uVar2) goto LAB_003c00a0;
    }
    bVar4 = true;
  }
  else {
    bVar4 = shl_bits(this,n & 0x3f);
    if (bVar4) goto LAB_003c0042;
LAB_003c00a0:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool shl(size_t n) noexcept {
    size_t rem = n % limb_bits;
    size_t div = n / limb_bits;
    if (rem != 0) {
      FASTFLOAT_TRY(shl_bits(rem));
    }
    if (div != 0) {
      FASTFLOAT_TRY(shl_limbs(div));
    }
    return true;
  }